

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O0

vector<LongReadMapping,_std::allocator<LongReadMapping>_> * __thiscall
LongReadsMapper::remove_shadowed_matches
          (LongReadsMapper *this,vector<LongReadMapping,_std::allocator<LongReadMapping>_> *matches)

{
  bool bVar1;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *this_00;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *pvVar2;
  reference pLVar3;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *in_RDX;
  LongReadMapping *in_RDI;
  LongReadMapping *m2;
  const_iterator __end2;
  const_iterator __begin2;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *__range2;
  bool use;
  value_type *m1;
  int mi1;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *filtered_matches;
  LongReadMapping *__args;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *in_stack_ffffffffffffffa0;
  __normal_iterator<const_LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
  local_40;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *local_38;
  byte local_29;
  const_reference local_28;
  int local_20;
  undefined1 local_19;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *local_18;
  
  local_19 = 0;
  __args = in_RDI;
  local_18 = in_RDX;
  std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::vector
            ((vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)0x3f7a7a);
  local_20 = 0;
  do {
    this_00 = (vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)(long)local_20;
    pvVar2 = (vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)
             std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::size(local_18);
    if (pvVar2 <= this_00) {
      return (vector<LongReadMapping,_std::allocator<LongReadMapping>_> *)__args;
    }
    local_28 = std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::operator[]
                         (local_18,(long)local_20);
    local_29 = 1;
    local_38 = local_18;
    local_40._M_current =
         (LongReadMapping *)
         std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::begin(this_00);
    std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
                               *)in_RDI,
                              (__normal_iterator<const_LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
                               *)this_00), bVar1) {
      pLVar3 = __gnu_cxx::
               __normal_iterator<const_LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
               ::operator*(&local_40);
      if (((pLVar3->qStart <= local_28->qStart) && (local_28->qEnd <= pLVar3->qEnd)) &&
         (local_28->score < pLVar3->score)) {
        local_29 = 0;
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_LongReadMapping_*,_std::vector<LongReadMapping,_std::allocator<LongReadMapping>_>_>
      ::operator++(&local_40);
    }
    if ((local_29 & 1) != 0) {
      std::vector<LongReadMapping,std::allocator<LongReadMapping>>::
      emplace_back<LongReadMapping_const&>(in_stack_ffffffffffffffa0,__args);
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

std::vector<LongReadMapping> LongReadsMapper::remove_shadowed_matches(const std::vector<LongReadMapping> &matches) const {
    std::vector<LongReadMapping> filtered_matches;

    for (auto mi1=0;mi1<matches.size();++mi1){
        auto &m1=matches[mi1];
        bool use=true;
        for (auto &m2: matches) {
            if (m2.qStart<=m1.qStart and m2.qEnd>=m1.qEnd and m2.score>m1.score){
                use=false;
                break;
            }
        }
        if (use) filtered_matches.emplace_back(m1);
    }

    return filtered_matches;
}